

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

int Sfm_DecFindBestVar2(Sfm_Dec_t *p,word (*Masks) [8])

{
  int iVar1;
  int iVar2;
  int d;
  int iVar3;
  int iVar4;
  int Counts [2] [2];
  
  iVar3 = 1000000000;
  iVar4 = -1;
  for (d = 0; d < p->nDivs; d = d + 1) {
    Sfm_DecVarCost(p,Masks,d,Counts);
    if (Counts[1][1] <= Counts[1][0] == Counts[0][0] < Counts[0][1]) {
      iVar1 = Counts[0][1];
      if (Counts[0][0] < Counts[0][1]) {
        iVar1 = Counts[0][0];
      }
      iVar2 = Counts[1][1];
      if (Counts[1][0] < Counts[1][1]) {
        iVar2 = Counts[1][0];
      }
      iVar2 = iVar2 + iVar1;
      if (iVar2 < iVar3) {
        iVar4 = d;
      }
      if (iVar2 <= iVar3) {
        iVar3 = iVar2;
      }
    }
  }
  return iVar4;
}

Assistant:

int Sfm_DecFindBestVar2( Sfm_Dec_t * p, word Masks[2][SFM_SIM_WORDS] )
{
    int Counts[2][2];
    int d, VarBest = -1, CostBest = ABC_INFINITY, Cost;
    for ( d = 0; d < p->nDivs; d++ )
    {
        Sfm_DecVarCost( p, Masks, d, Counts );
        if ( (Counts[0][0] < Counts[0][1]) == (Counts[1][0] < Counts[1][1]) )
            continue;
        Cost = Abc_MinInt(Counts[0][0], Counts[0][1]) + Abc_MinInt(Counts[1][0], Counts[1][1]);
        if ( CostBest > Cost )
        {
            CostBest = Cost;
            VarBest = d;
        }
    }
    return VarBest;
}